

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int xmlParseElementStart(xmlParserCtxtPtr ctxt)

{
  xmlParserInputPtr pxVar1;
  _xmlNode *p_Var2;
  xmlDocPtr doc;
  xmlChar *pxVar3;
  _xmlSAXHandler *p_Var4;
  int *piVar5;
  xmlChar *pxVar6;
  xmlChar *pxVar7;
  uint uVar8;
  xmlChar *pxVar9;
  int *piVar10;
  int iVar11;
  xmlNodePtr pxVar12;
  int iVar13;
  int nbNs;
  xmlChar *URI;
  xmlChar *prefix;
  undefined8 in_stack_ffffffffffffff78;
  int local_6c;
  xmlChar *local_68;
  xmlChar *local_60;
  xmlParserNodeInfo local_58;
  
  iVar11 = 0x800;
  if (((uint)ctxt->options >> 0x13 & 1) == 0) {
    iVar11 = 0x100;
  }
  local_60 = (xmlChar *)0x0;
  local_68 = (xmlChar *)0x0;
  local_6c = 0;
  iVar13 = ctxt->nameNr;
  if (iVar11 < iVar13) {
    xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_RESOURCE_LIMIT,XML_ERR_FATAL,
               (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,iVar13,
               "Excessive depth in document: %d use XML_PARSE_HUGE option\n",
               CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),iVar13));
    xmlHaltParser(ctxt);
    iVar13 = -1;
  }
  else {
    if (ctxt->record_info != 0) {
      pxVar1 = ctxt->input;
      local_58.begin_pos = (unsigned_long)(pxVar1->cur + (pxVar1->consumed - (long)pxVar1->base));
      local_58.begin_line = (unsigned_long)pxVar1->line;
    }
    if (ctxt->spaceNr == 0) {
      iVar11 = -1;
    }
    else {
      iVar11 = -1;
      if (*ctxt->space != -2) {
        iVar11 = *ctxt->space;
      }
    }
    spacePush(ctxt,iVar11);
    iVar11 = ctxt->input->line;
    if (ctxt->sax2 == 0) {
      pxVar9 = xmlParseStartTag(ctxt);
    }
    else {
      pxVar9 = xmlParseStartTag2(ctxt,&local_60,&local_68,&local_6c);
    }
    pxVar7 = local_60;
    pxVar6 = local_68;
    iVar13 = local_6c;
    if (pxVar9 == (xmlChar *)0x0) {
      iVar11 = ctxt->spaceNr;
      iVar13 = -1;
      if (0 < (long)iVar11) {
        ctxt->spaceNr = iVar11 - 1U;
        piVar5 = ctxt->spaceTab;
        piVar10 = piVar5 + (long)iVar11 + -2;
        if (iVar11 == 1) {
          piVar10 = piVar5;
        }
        ctxt->space = piVar10;
        piVar5[iVar11 - 1U] = -1;
      }
    }
    else {
      nameNsPush(ctxt,pxVar9,local_60,local_68,iVar11,local_6c);
      p_Var2 = ctxt->node;
      if ((((ctxt->validate != 0) && (ctxt->wellFormed != 0)) &&
          (doc = ctxt->myDoc, p_Var2 != (_xmlNode *)0x0 && doc != (xmlDocPtr)0x0)) &&
         (p_Var2 == doc->children)) {
        uVar8 = xmlValidateRoot(&ctxt->vctxt,doc);
        ctxt->valid = ctxt->valid & uVar8;
      }
      pxVar1 = ctxt->input;
      pxVar3 = pxVar1->cur;
      if (*pxVar3 == '>') {
        pxVar1->col = pxVar1->col + 1;
        pxVar1->cur = pxVar3 + 1;
        if (pxVar3[1] == '\0') {
          xmlParserGrow(ctxt);
        }
        iVar13 = 0;
        if (p_Var2 == (_xmlNode *)0x0) {
          return 0;
        }
        if (ctxt->record_info == 0) {
          return 0;
        }
        local_58.end_pos = 0;
        local_58.end_line = 0;
      }
      else {
        if ((*pxVar3 != '/') || (pxVar3[1] != '>')) {
          xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_GT_REQUIRED,XML_ERR_FATAL,pxVar9,
                     (xmlChar *)0x0,(xmlChar *)0x0,iVar11,
                     "Couldn\'t find end of Start Tag %s line %d\n",pxVar9,iVar11,0);
          iVar11 = ctxt->nodeNr;
          if (0 < (long)iVar11) {
            ctxt->nodeNr = iVar11 - 1U;
            if (iVar11 == 1) {
              pxVar12 = (xmlNodePtr)0x0;
            }
            else {
              pxVar12 = ctxt->nodeTab[(long)iVar11 + -2];
            }
            ctxt->node = pxVar12;
            ctxt->nodeTab[iVar11 - 1U] = (xmlNodePtr)0x0;
          }
          iVar11 = ctxt->nameNr;
          if (0 < (long)iVar11) {
            ctxt->nameNr = iVar11 - 1U;
            if (iVar11 == 1) {
              pxVar9 = (xmlChar *)0x0;
            }
            else {
              pxVar9 = ctxt->nameTab[(long)iVar11 + -2];
            }
            ctxt->name = pxVar9;
            ctxt->nameTab[iVar11 - 1U] = (xmlChar *)0x0;
          }
          iVar11 = ctxt->spaceNr;
          if (0 < (long)iVar11) {
            ctxt->spaceNr = iVar11 - 1U;
            piVar5 = ctxt->spaceTab;
            piVar10 = piVar5 + (long)iVar11 + -2;
            if (iVar11 == 1) {
              piVar10 = piVar5;
            }
            ctxt->space = piVar10;
            piVar5[iVar11 - 1U] = -1;
          }
          if (iVar13 < 1) {
            return -1;
          }
          xmlParserNsPop(ctxt,iVar13);
          return -1;
        }
        pxVar1->cur = pxVar3 + 2;
        pxVar1->col = pxVar1->col + 2;
        if (pxVar3[2] == '\0') {
          xmlParserGrow(ctxt);
        }
        p_Var4 = ctxt->sax;
        if (ctxt->sax2 == 0) {
          if (((p_Var4 != (_xmlSAXHandler *)0x0) && (p_Var4->endElement != (endElementSAXFunc)0x0))
             && (ctxt->disableSAX == 0)) {
            (*p_Var4->endElement)(ctxt->userData,pxVar9);
          }
        }
        else if (((p_Var4 != (_xmlSAXHandler *)0x0) &&
                 (p_Var4->endElementNs != (endElementNsSAX2Func)0x0)) && (ctxt->disableSAX == 0)) {
          (*p_Var4->endElementNs)(ctxt->userData,pxVar9,pxVar7,pxVar6);
        }
        iVar11 = ctxt->nameNr;
        if (0 < (long)iVar11) {
          ctxt->nameNr = iVar11 - 1U;
          if (iVar11 == 1) {
            pxVar9 = (xmlChar *)0x0;
          }
          else {
            pxVar9 = ctxt->nameTab[(long)iVar11 + -2];
          }
          ctxt->name = pxVar9;
          ctxt->nameTab[iVar11 - 1U] = (xmlChar *)0x0;
        }
        iVar11 = ctxt->spaceNr;
        if (0 < (long)iVar11) {
          ctxt->spaceNr = iVar11 - 1U;
          piVar5 = ctxt->spaceTab;
          piVar10 = piVar5 + (long)iVar11 + -2;
          if (iVar11 == 1) {
            piVar10 = piVar5;
          }
          ctxt->space = piVar10;
          piVar5[iVar11 - 1U] = -1;
        }
        if (0 < iVar13) {
          xmlParserNsPop(ctxt,iVar13);
        }
        iVar13 = 1;
        if (p_Var2 == (_xmlNode *)0x0) {
          return 1;
        }
        if (ctxt->record_info == 0) {
          return 1;
        }
        pxVar1 = ctxt->input;
        local_58.end_pos = (unsigned_long)(pxVar1->cur + (pxVar1->consumed - (long)pxVar1->base));
        local_58.end_line = (unsigned_long)pxVar1->line;
      }
      local_58.node = p_Var2;
      xmlParserAddNodeInfo(ctxt,&local_58);
    }
  }
  return iVar13;
}

Assistant:

static int
xmlParseElementStart(xmlParserCtxtPtr ctxt) {
    int maxDepth = (ctxt->options & XML_PARSE_HUGE) ? 2048 : 256;
    const xmlChar *name;
    const xmlChar *prefix = NULL;
    const xmlChar *URI = NULL;
    xmlParserNodeInfo node_info;
    int line;
    xmlNodePtr cur;
    int nbNs = 0;

    if (ctxt->nameNr > maxDepth) {
        xmlFatalErrMsgInt(ctxt, XML_ERR_RESOURCE_LIMIT,
                "Excessive depth in document: %d use XML_PARSE_HUGE option\n",
                ctxt->nameNr);
	xmlHaltParser(ctxt);
	return(-1);
    }

    /* Capture start position */
    if (ctxt->record_info) {
        node_info.begin_pos = ctxt->input->consumed +
                          (CUR_PTR - ctxt->input->base);
	node_info.begin_line = ctxt->input->line;
    }

    if (ctxt->spaceNr == 0)
	spacePush(ctxt, -1);
    else if (*ctxt->space == -2)
	spacePush(ctxt, -1);
    else
	spacePush(ctxt, *ctxt->space);

    line = ctxt->input->line;
#ifdef LIBXML_SAX1_ENABLED
    if (ctxt->sax2)
#endif /* LIBXML_SAX1_ENABLED */
        name = xmlParseStartTag2(ctxt, &prefix, &URI, &nbNs);
#ifdef LIBXML_SAX1_ENABLED
    else
	name = xmlParseStartTag(ctxt);
#endif /* LIBXML_SAX1_ENABLED */
    if (name == NULL) {
	spacePop(ctxt);
        return(-1);
    }
    nameNsPush(ctxt, name, prefix, URI, line, nbNs);
    cur = ctxt->node;

#ifdef LIBXML_VALID_ENABLED
    /*
     * [ VC: Root Element Type ]
     * The Name in the document type declaration must match the element
     * type of the root element.
     */
    if (ctxt->validate && ctxt->wellFormed && ctxt->myDoc &&
        ctxt->node && (ctxt->node == ctxt->myDoc->children))
        ctxt->valid &= xmlValidateRoot(&ctxt->vctxt, ctxt->myDoc);
#endif /* LIBXML_VALID_ENABLED */

    /*
     * Check for an Empty Element.
     */
    if ((RAW == '/') && (NXT(1) == '>')) {
        SKIP(2);
	if (ctxt->sax2) {
	    if ((ctxt->sax != NULL) && (ctxt->sax->endElementNs != NULL) &&
		(!ctxt->disableSAX))
		ctxt->sax->endElementNs(ctxt->userData, name, prefix, URI);
#ifdef LIBXML_SAX1_ENABLED
	} else {
	    if ((ctxt->sax != NULL) && (ctxt->sax->endElement != NULL) &&
		(!ctxt->disableSAX))
		ctxt->sax->endElement(ctxt->userData, name);
#endif /* LIBXML_SAX1_ENABLED */
	}
	namePop(ctxt);
	spacePop(ctxt);
	if (nbNs > 0)
	    xmlParserNsPop(ctxt, nbNs);
	if (cur != NULL && ctxt->record_info) {
            node_info.node = cur;
            node_info.end_pos = ctxt->input->consumed +
                                (CUR_PTR - ctxt->input->base);
            node_info.end_line = ctxt->input->line;
            xmlParserAddNodeInfo(ctxt, &node_info);
	}
	return(1);
    }
    if (RAW == '>') {
        NEXT1;
        if (cur != NULL && ctxt->record_info) {
            node_info.node = cur;
            node_info.end_pos = 0;
            node_info.end_line = 0;
            xmlParserAddNodeInfo(ctxt, &node_info);
        }
    } else {
        xmlFatalErrMsgStrIntStr(ctxt, XML_ERR_GT_REQUIRED,
		     "Couldn't find end of Start Tag %s line %d\n",
		                name, line, NULL);

	/*
	 * end of parsing of this node.
	 */
	nodePop(ctxt);
	namePop(ctxt);
	spacePop(ctxt);
	if (nbNs > 0)
	    xmlParserNsPop(ctxt, nbNs);
	return(-1);
    }

    return(0);
}